

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spoa_test.cpp
# Opt level: O2

void __thiscall
spoa::test::SpoaTest_SemiGlobalConvexWithQualities_Test::SpoaTest_SemiGlobalConvexWithQualities_Test
          (SpoaTest_SemiGlobalConvexWithQualities_Test *this)

{
  SpoaTest::SpoaTest(&this->super_SpoaTest);
  (this->super_SpoaTest).super_Test._vptr_Test = (_func_int **)&PTR__SpoaTest_001588f8;
  return;
}

Assistant:

TEST_F(SpoaTest, SemiGlobalConvexWithQualities) {
  Initialize(AlignmentType::kOV, 5, -4, -8, -6, -10, -2, true);
  Align();

  std::string c =
      "GTATGATGCGCTTTGTTGGCGCGGTGGCTTGATGCAGGGGCTAATCGACCTCTGGCAACCACTTTTCCATGA"
      "CAGGAGTTGAATATGGCATTCAGTAATCCCTTCGATGATCCGCAGGGAGCGTTTTACATATTGCGCAATGCG"
      "CAGGGGCAATTCAGTCTGTGGCCGCAACAATGCGTCTTACCGGCAGGCTGGGACATTGTGTGTCAGCCGCAG"
      "TCACAGGCGTCCTGCCAGCAGTGGCTGGAAGCCCACTGGCGTACTCTGACACCGACGAATTTTACCCAGTTG"
      "CAGGGAGGCACAATGAGCCAGCATTTACCTTTGGTCGCCGCACAGCCCGGCATCTGGATGGCAGAAAAACTG"
      "TCAGAATTACCCTCCGCCTGGAGCGTGGCGCATTACGTTGAGTTAACCGGAGAGGTTGATTCGCCATTACTG"
      "GCCCGCGCGGTGGTTGCCGGACTAGCGCAAAGCAGATACGC";

  Check(c);
}